

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O0

int X509_CRL_set_version(X509_CRL *x,long version)

{
  ASN1_INTEGER *pAVar1;
  long version_local;
  X509_CRL *x_local;
  
  if (x == (X509_CRL *)0x0) {
    x_local._4_4_ = 0;
  }
  else if ((version < 0) || (1 < version)) {
    ERR_put_error(0xb,0,0x8c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509cset.cc"
                  ,0x1e);
    x_local._4_4_ = 0;
  }
  else if (version == 0) {
    ASN1_INTEGER_free(x->crl->version);
    x->crl->version = (ASN1_INTEGER *)0x0;
    x_local._4_4_ = 1;
  }
  else {
    if (x->crl->version == (ASN1_INTEGER *)0x0) {
      pAVar1 = ASN1_INTEGER_new();
      x->crl->version = pAVar1;
      if (x->crl->version == (ASN1_INTEGER *)0x0) {
        return 0;
      }
    }
    x_local._4_4_ = ASN1_INTEGER_set_int64((ASN1_INTEGER *)x->crl->version,version);
  }
  return x_local._4_4_;
}

Assistant:

int X509_CRL_set_version(X509_CRL *x, long version) {
  if (x == NULL) {
    return 0;
  }

  if (version < X509_CRL_VERSION_1 || version > X509_CRL_VERSION_2) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
    return 0;
  }

  // v1(0) is default and is represented by omitting the version.
  if (version == X509_CRL_VERSION_1) {
    ASN1_INTEGER_free(x->crl->version);
    x->crl->version = NULL;
    return 1;
  }

  if (x->crl->version == NULL) {
    x->crl->version = ASN1_INTEGER_new();
    if (x->crl->version == NULL) {
      return 0;
    }
  }
  return ASN1_INTEGER_set_int64(x->crl->version, version);
}